

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

Expression *
slang::ast::tryBindSpecialMethod
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  int iVar1;
  RandMode RVar2;
  Symbol *this;
  Expression *pEVar3;
  Compilation *compilation_00;
  char *__s1;
  size_type __rlen;
  string_view methodName;
  
  this = Expression::getSymbolReference(expr,true);
  if (this == (Symbol *)0x0) {
    return (Expression *)0x0;
  }
  pEVar3 = (Expression *)(selector->name)._M_len;
  __s1 = (selector->name)._M_str;
  if ((pEVar3 == (Expression *)0x9) && (iVar1 = bcmp(__s1,"rand_mode",9), iVar1 == 0)) {
    RVar2 = Symbol::getRandMode(this);
    if (RVar2 == None) {
      return (Expression *)0x0;
    }
    pEVar3 = (Expression *)(selector->name)._M_len;
    __s1 = (selector->name)._M_str;
    compilation_00 = (Compilation *)0x3f;
  }
  else {
    compilation_00 = (Compilation *)(ulong)this->kind;
  }
  methodName._M_str = (char *)invocation;
  methodName._M_len = (size_t)__s1;
  pEVar3 = CallExpression::fromBuiltInMethod
                     ((CallExpression *)compilation,compilation_00,(SymbolKind)expr,pEVar3,
                      methodName,(InvocationExpressionSyntax *)withClause,
                      (ArrayOrRandomizeMethodExpressionSyntax *)context,context);
  return pEVar3;
}

Assistant:

static Expression* tryBindSpecialMethod(Compilation& compilation, const Expression& expr,
                                        const LookupResult::MemberSelector& selector,
                                        const InvocationExpressionSyntax* invocation,
                                        const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                        const ASTContext& context) {
    auto sym = expr.getSymbolReference();
    if (!sym)
        return nullptr;

    // There is a built-in 'rand_mode' method that is present on every 'rand' and 'randc'
    // class property, and additionally on subelements of those properties.
    if (selector.name == "rand_mode"sv) {
        if (sym->getRandMode() == RandMode::None)
            return nullptr;

        return CallExpression::fromBuiltInMethod(compilation, SymbolKind::ClassProperty, expr,
                                                 selector.name, invocation, withClause, context);
    }

    return CallExpression::fromBuiltInMethod(compilation, sym->kind, expr, selector.name,
                                             invocation, withClause, context);
}